

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void forbody(LexState *ls,int base,int line,int nvars,int isgen)

{
  FuncState *fs;
  int pc;
  int iVar1;
  BlockCnt bl;
  
  fs = ls->fs;
  checknext(ls,0x102);
  pc = luaK_codeABx(fs,forbody::forprep[(uint)isgen],base,0);
  fs->freereg = fs->freereg + 0xff;
  enterblock(fs,&bl,'\0');
  adjustlocalvars(ls,nvars);
  luaK_reserveregs(fs,nvars);
  block(ls);
  leaveblock(fs);
  iVar1 = luaK_getlabel(fs);
  fixforjump(fs,pc,iVar1,0);
  if (isgen != 0) {
    luaK_codeABCk(fs,OP_TFORCALL,base,0,nvars,0);
    luaK_fixline(fs,line);
  }
  iVar1 = luaK_codeABx(fs,forbody::forloop[(uint)isgen],base,0);
  fixforjump(fs,iVar1,pc + 1,1);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isgen) {
  /* forbody -> DO block */
  static const OpCode forprep[2] = {OP_FORPREP, OP_TFORPREP};
  static const OpCode forloop[2] = {OP_FORLOOP, OP_TFORLOOP};
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  checknext(ls, TK_DO);
  prep = luaK_codeABx(fs, forprep[isgen], base, 0);
  fs->freereg--;  /* both 'forprep' remove one register from the stack */
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  fixforjump(fs, prep, luaK_getlabel(fs), 0);
  if (isgen) {  /* generic for? */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
  }
  endfor = luaK_codeABx(fs, forloop[isgen], base, 0);
  fixforjump(fs, endfor, prep + 1, 1);
  luaK_fixline(fs, line);
}